

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O2

uint32_t __thiscall BoardIO::ReadIPv4Address(BoardIO *this)

{
  BasePort *pBVar1;
  ostream *poVar2;
  ulong uVar3;
  uint32_t read_data;
  
  pBVar1 = this->port;
  if (((pBVar1 == (BasePort *)0x0) || (uVar3 = (ulong)this->BoardId, 0xf < uVar3)) ||
     ((uint)pBVar1->FirmwareVersion[uVar3] < 7)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "AmpIO::ReadIPv4Address: requires firmware 7 or above");
    std::endl<char,std::char_traits<char>>(poVar2);
    read_data = 0;
  }
  else {
    read_data = 0;
    (*pBVar1->_vptr_BasePort[0x23])(pBVar1,uVar3,0xb,&read_data);
  }
  return read_data;
}

Assistant:

uint32_t BoardIO::ReadIPv4Address(void) const
{
    if (GetFirmwareVersion() < 7) {
        std::cerr << "AmpIO::ReadIPv4Address: requires firmware 7 or above" << std::endl;
        return 0;
    }
    uint32_t read_data = 0;
    if (port)
        port->ReadQuadlet(BoardId, BoardIO::IP_ADDR, read_data);
    return read_data;
}